

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_fuzzer.cc
# Opt level: O2

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  QPDF q;
  Buffer buf;
  shared_ptr<BufferInputSource> is;
  QPDF local_70;
  Buffer local_68;
  string local_60;
  __shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Buffer *local_30;
  JSON local_28;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,this->data,this->data + this->size);
  JSON::parse(&local_28,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_60);
  QPDF::QPDF(&local_70);
  QPDF::setMaxWarnings(&local_70,1000);
  Buffer::Buffer(&local_68,this->data,this->size);
  local_30 = &local_68;
  std::make_shared<BufferInputSource,char_const(&)[5],Buffer*>
            ((char (*) [5])&local_60,(Buffer **)0x2316f1);
  std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BufferInputSource,void>
            (local_40,(__shared_ptr<BufferInputSource,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
  QPDF::createFromJSON(&local_70,(shared_ptr<InputSource> *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
  Buffer::~Buffer(&local_68);
  QPDF::~QPDF(&local_70);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    try {
        JSON::parse(std::string(reinterpret_cast<char const*>(data), size));
    } catch (std::runtime_error& e) {
        std::cerr << "runtime_error parsing json: " << e.what() << std::endl;
    }
    QPDF q;
    q.setMaxWarnings(1000);
    Buffer buf(const_cast<unsigned char*>(data), size);
    auto is = std::make_shared<BufferInputSource>("json", &buf);
    q.createFromJSON(is);
}